

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_pool_move_fibers_to_parent_pool(cilk_fiber_pool *pool,uint num_to_keep)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint in_ESI;
  long in_RDI;
  cilk_fiber_pool *parent_pool;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                  ,0xc6,"pool->parent");
  }
  lVar1 = *(long *)(in_RDI + 0x10);
  if (*(uint *)(lVar1 + 0x24) < *(uint *)(lVar1 + 0x20)) {
    spin_mutex_lock((spin_mutex *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    while( true ) {
      bVar3 = false;
      if (*(uint *)(lVar1 + 0x24) < *(uint *)(lVar1 + 0x20)) {
        bVar3 = in_ESI < *(uint *)(in_RDI + 0x24);
      }
      if (!bVar3) break;
      uVar4 = *(int *)(in_RDI + 0x24) - 1;
      *(uint *)(in_RDI + 0x24) = uVar4;
      uVar2 = *(undefined8 *)(*(long *)(in_RDI + 0x18) + (ulong)uVar4 * 8);
      uVar4 = *(uint *)(lVar1 + 0x24);
      *(uint *)(lVar1 + 0x24) = uVar4 + 1;
      *(undefined8 *)(*(long *)(lVar1 + 0x18) + (ulong)uVar4 * 8) = uVar2;
    }
    if (*(int *)(in_RDI + 0x28) < 0) {
      *(int *)(lVar1 + 0x28) = *(int *)(in_RDI + 0x28) + *(int *)(lVar1 + 0x28);
      *(undefined4 *)(in_RDI + 0x28) = 0;
    }
    spin_mutex_unlock((spin_mutex *)0x108d83);
  }
  return;
}

Assistant:

static void cilk_fiber_pool_move_fibers_to_parent_pool(cilk_fiber_pool* pool,
                                                       unsigned num_to_keep)
{
    // ASSERT: We should hold the lock on pool (if it has one).
    CILK_ASSERT(pool->parent);
    cilk_fiber_pool* parent_pool = pool->parent;

    // Move fibers from our pool to the parent until we either run out
    // of space in the parent, or hit our threshold.
    //
    // This operation must be done while holding the parent lock.

    // If the parent pool appears to be full, just return early.
    if (parent_pool->size >= parent_pool->max_size)
        return;

    spin_mutex_lock(pool->parent->lock);
    while ((parent_pool->size < parent_pool->max_size) &&
           (pool->size > num_to_keep)) {
        parent_pool->fibers[parent_pool->size++] =
            pool->fibers[--pool->size];
    }

    // If the child pool has deallocated more than fibers to the heap
    // than it has allocated, then transfer this "surplus" to the
    // parent, so that the parent is free to allocate more from the
    // heap.
    // 
    // This transfer means that the total in the parent can
    // temporarily go negative.
    if (pool->total < 0) {
        // Reduce parent total by the surplus we have in the local
        // pool.
        parent_pool->total += pool->total;
        pool->total = 0;
    }

    spin_mutex_unlock(pool->parent->lock);
}